

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.h
# Opt level: O2

Status __thiscall
bloomfilter::BloomFilter<unsigned_long,_12UL,_false,_hashing::SimpleMixSplit,_8>::Contain
          (BloomFilter<unsigned_long,_12UL,_false,_hashing::SimpleMixSplit,_8> *this,
          unsigned_long *key)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint64_t uVar3;
  ulong uVar4;
  int i;
  uint uVar5;
  
  uVar3 = hashing::SimpleMixSplit::operator()(&this->hasher,*key);
  uVar5 = 0;
  for (uVar4 = uVar3 << 0x20 | uVar3 >> 0x20;
      (uVar5 != 8 &&
      (auVar1._8_8_ = 0, auVar1._0_8_ = this->arrayLength, auVar2._8_8_ = 0, auVar2._0_8_ = uVar4,
      (this->data[SUB168(auVar1 * auVar2,8)] >> (uVar4 & 0x3f) & 1) != 0)); uVar4 = uVar4 + uVar3) {
    uVar5 = uVar5 + 1;
  }
  return (Status)(uVar5 < 8);
}

Assistant:

Status BloomFilter<ItemType, bits_per_item, branchless, HashFamily, k>::Contain(
    const ItemType &key) const {
  uint64_t hash = hasher(key);
  uint64_t a = (hash >> 32) | (hash << 32);;
  uint64_t b = hash;
  if (branchless && k >= 3) {
    int b0 = data[fastrangesize(a, this->arrayLength)] >> (a & 63);
    a += b;
    int b1 = data[fastrangesize(a, this->arrayLength)] >> (a & 63);
    a += b;
    int b2 = data[fastrangesize(a, this->arrayLength)] >> (a & 63);
    if ((b0 & b1 & b2 & 1) == 0) {
        return NotFound;
    }
    for (int i = 3; i < k; i++) {
      a += b;
      if (((data[fastrangesize(a, this->arrayLength)] >> (a & 63)) & 1) == 0) {
          return NotFound;
      }
    }
    return Ok;
  }
  for (int i = 0; i < k; i++) {
    if ((data[fastrangesize(a, this->arrayLength)] & getBit(a)) == 0) {
      return NotFound;
    }
    a += b;
  }
  return Ok;
}